

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O2

void __thiscall DDecalFader::Tick(DDecalFader *this)

{
  TObjPtr<DBaseDecal> *obj;
  int iVar1;
  DBaseDecal *pDVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  
  obj = &(this->super_DDecalThinker).TheDecal;
  pDVar2 = GC::ReadBarrier<DBaseDecal>((DBaseDecal **)obj);
  if (pDVar2 == (DBaseDecal *)0x0) {
LAB_0038fe16:
    (*(this->super_DDecalThinker).super_DThinker.super_DObject._vptr_DObject[4])(this);
    return;
  }
  iVar1 = this->TimeToStartDecay;
  if ((iVar1 <= level.maptime) && ((bglobal._16_1_ & 1) == 0)) {
    iVar3 = this->TimeToEndDecay;
    if (iVar3 <= level.maptime) {
      pDVar2 = GC::ReadBarrier<DBaseDecal>((DBaseDecal **)obj);
      (*(pDVar2->super_DThinker).super_DObject._vptr_DObject[4])(pDVar2);
      goto LAB_0038fe16;
    }
    dVar5 = this->StartTrans;
    if ((dVar5 == -1.0) && (!NAN(dVar5))) {
      pDVar2 = GC::ReadBarrier<DBaseDecal>((DBaseDecal **)obj);
      dVar5 = pDVar2->Alpha;
      this->StartTrans = dVar5;
      iVar1 = this->TimeToStartDecay;
      iVar3 = this->TimeToEndDecay;
    }
    iVar4 = iVar3 - level.maptime;
    pDVar2 = GC::ReadBarrier<DBaseDecal>((DBaseDecal **)obj);
    pDVar2->Alpha = ((double)iVar4 * dVar5) / (double)(iVar3 - iVar1);
  }
  return;
}

Assistant:

void DDecalFader::Tick ()
{
	if (TheDecal == NULL)
	{
		Destroy ();
	}
	else
	{
		if (level.maptime < TimeToStartDecay || bglobal.freeze)
		{
			return;
		}
		else if (level.maptime >= TimeToEndDecay)
		{
			TheDecal->Destroy ();		// remove the decal
			Destroy ();					// remove myself
			return;
		}
		if (StartTrans == -1)
		{
			StartTrans = TheDecal->Alpha;
		}

		int distanceToEnd = TimeToEndDecay - level.maptime;
		int fadeDistance = TimeToEndDecay - TimeToStartDecay;
		TheDecal->Alpha = StartTrans * distanceToEnd / fadeDistance;
	}
}